

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O1

void __thiscall
ArgWrapper<wchar_t>::ArgWrapper
          (ArgWrapper<wchar_t> *this,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *in_args)

{
  long lVar1;
  wchar_t **ppwVar2;
  pointer pbVar3;
  long lVar4;
  
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&this->m_args,in_args);
  lVar1 = (long)(in_args->
                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(in_args->
                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  ppwVar2 = (wchar_t **)operator_new__(-(ulong)(lVar1 + 1U >> 0x3d != 0) | lVar1 * 8 + 8U);
  (this->m_argv)._M_t.
  super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
  super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl = ppwVar2;
  pbVar3 = (this->m_args).
           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_args).
      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    lVar1 = 0;
    lVar4 = 0;
    do {
      (this->m_argv)._M_t.
      super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
      super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl[lVar4] =
           *(wchar_t **)((long)&(pbVar3->_M_dataplus)._M_p + lVar1);
      lVar4 = lVar4 + 1;
      pbVar3 = (this->m_args).
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar1 = lVar1 + 0x20;
    } while (lVar4 != (long)(this->m_args).
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5);
  }
  *(undefined8 *)
   ((long)(this->m_argv)._M_t.
          super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
          super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl +
   ((long)(in_args->
          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish -
    (long)(in_args->
          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start >> 2)) = 0;
  return;
}

Assistant:

ArgWrapper(std::vector<std::basic_string<CharT>> in_args)
		: m_args{ in_args },
		m_argv{ new const CharT*[in_args.size() + 1] } {
		// Populate m_argv
		for (size_t index = 0; index != m_args.size(); ++index) {
			m_argv[index] = m_args[index].c_str();
		}
		m_argv[in_args.size()] = nullptr; // last arg is always nullptr
	}